

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEditPrivate::ensureVisible(QTextEditPrivate *this,QRectF *_rect)

{
  int iVar1;
  QWidgetData *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Representation value;
  QScrollBar *pQVar6;
  int iVar7;
  int iVar8;
  Representation RVar9;
  QRect QVar10;
  
  QVar10 = QRectF::toRect(_rect);
  pQVar6 = (this->super_QAbstractScrollAreaPrivate).vbar;
  RVar9 = QVar10.x2.m_i;
  if ((((((pQVar6->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0) &&
      (iVar4 = QAbstractSlider::maximum(&pQVar6->super_QAbstractSlider), iVar4 < QVar10.y2.m_i.m_i))
     || ((pQVar6 = (this->super_QAbstractScrollAreaPrivate).hbar,
         (((pQVar6->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0 &&
         (iVar4 = QAbstractSlider::maximum(&pQVar6->super_QAbstractSlider), iVar4 < RVar9.m_i)))) {
    adjustScrollbars(this);
  }
  pQVar2 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  iVar4 = (pQVar2->crect).x2.m_i;
  iVar7 = (pQVar2->crect).x1.m_i;
  iVar8 = (pQVar2->crect).y2.m_i;
  iVar1 = (pQVar2->crect).y1.m_i;
  bVar3 = QWidget::isRightToLeft
                    (*(QWidget **)
                      &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  iVar5 = horizontalOffset(this);
  value = QVar10.x1.m_i;
  if (value.m_i < iVar5) {
    pQVar6 = (this->super_QAbstractScrollAreaPrivate).hbar;
    if (bVar3) {
      iVar4 = QAbstractSlider::maximum(&pQVar6->super_QAbstractSlider);
      value.m_i = iVar4 - value.m_i;
    }
  }
  else {
    iVar7 = (iVar4 - iVar7) + 1;
    iVar4 = horizontalOffset(this);
    if ((int)(RVar9.m_i + 1U) <= iVar4 + iVar7) goto LAB_0045f0ae;
    pQVar6 = (this->super_QAbstractScrollAreaPrivate).hbar;
    if (bVar3) {
      iVar4 = QAbstractSlider::maximum(&pQVar6->super_QAbstractSlider);
      value.m_i = iVar7 + ~RVar9.m_i + iVar4;
    }
    else {
      value.m_i = (RVar9.m_i + 1U) - iVar7;
    }
  }
  QAbstractSlider::setValue(&pQVar6->super_QAbstractSlider,value.m_i);
LAB_0045f0ae:
  RVar9 = QVar10.y1.m_i;
  iVar4 = verticalOffset(this);
  if (RVar9.m_i < iVar4) {
    pQVar6 = (this->super_QAbstractScrollAreaPrivate).vbar;
  }
  else {
    iVar7 = (iVar8 - iVar1) + 1;
    iVar8 = QVar10.y2.m_i.m_i + 1;
    iVar4 = verticalOffset(this);
    if (iVar8 <= iVar4 + iVar7) {
      return;
    }
    pQVar6 = (this->super_QAbstractScrollAreaPrivate).vbar;
    RVar9.m_i = iVar8 - iVar7;
  }
  QAbstractSlider::setValue(&pQVar6->super_QAbstractSlider,RVar9.m_i);
  return;
}

Assistant:

void QTextEditPrivate::ensureVisible(const QRectF &_rect)
{
    const QRect rect = _rect.toRect();
    if ((vbar->isVisible() && vbar->maximum() < rect.bottom())
        || (hbar->isVisible() && hbar->maximum() < rect.right()))
        adjustScrollbars();
    const int visibleWidth = viewport->width();
    const int visibleHeight = viewport->height();
    const bool rtl = q_func()->isRightToLeft();

    if (rect.x() < horizontalOffset()) {
        if (rtl)
            hbar->setValue(hbar->maximum() - rect.x());
        else
            hbar->setValue(rect.x());
    } else if (rect.x() + rect.width() > horizontalOffset() + visibleWidth) {
        if (rtl)
            hbar->setValue(hbar->maximum() - (rect.x() + rect.width() - visibleWidth));
        else
            hbar->setValue(rect.x() + rect.width() - visibleWidth);
    }

    if (rect.y() < verticalOffset())
        vbar->setValue(rect.y());
    else if (rect.y() + rect.height() > verticalOffset() + visibleHeight)
        vbar->setValue(rect.y() + rect.height() - visibleHeight);
}